

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O3

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderBool
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,ProtoStreamObjectSource *os,
          Type *type,StringPiece field_name,ObjectWriter *ow)

{
  uint32 first_byte_or_zero;
  uint first_byte_or_zero_00;
  byte *pbVar1;
  byte *pbVar2;
  CodedInputStream *pCVar3;
  unsigned_long uVar4;
  bool bVar5;
  pair<unsigned_long,_bool> pVar6;
  
  pCVar3 = this->stream_;
  pbVar1 = pCVar3->buffer_;
  if (pbVar1 < pCVar3->buffer_end_) {
    first_byte_or_zero = (uint32)*pbVar1;
    if ((char)*pbVar1 < '\0') goto LAB_003170f1;
    pCVar3->buffer_ = pbVar1 + 1;
  }
  else {
    first_byte_or_zero = 0;
LAB_003170f1:
    first_byte_or_zero = io::CodedInputStream::ReadTagFallback(pCVar3,first_byte_or_zero);
  }
  pCVar3->last_tag_ = first_byte_or_zero;
  if (first_byte_or_zero == 0) {
    bVar5 = false;
    goto LAB_00317184;
  }
  pCVar3 = this->stream_;
  pbVar2 = pCVar3->buffer_;
  pbVar1 = pCVar3->buffer_end_;
  if ((pbVar2 < pbVar1) && (uVar4 = (unsigned_long)(char)*pbVar2, -1 < (long)uVar4)) {
    pbVar2 = pbVar2 + 1;
    pCVar3->buffer_ = pbVar2;
  }
  else {
    pVar6 = io::CodedInputStream::ReadVarint64Fallback(pCVar3);
    uVar4 = pVar6.first;
    pCVar3 = this->stream_;
    pbVar2 = pCVar3->buffer_;
    pbVar1 = pCVar3->buffer_end_;
  }
  if (pbVar2 < pbVar1) {
    first_byte_or_zero_00 = (uint)*pbVar2;
    if ((char)*pbVar2 < '\0') goto LAB_00317169;
    pCVar3->buffer_ = pbVar2 + 1;
  }
  else {
    first_byte_or_zero_00 = 0;
LAB_00317169:
    first_byte_or_zero_00 = io::CodedInputStream::ReadTagFallback(pCVar3,first_byte_or_zero_00);
  }
  pCVar3->last_tag_ = first_byte_or_zero_00;
  bVar5 = uVar4 != 0;
LAB_00317184:
  (**(code **)(*(long *)field_name.length_ + 0x30))
            ((long *)field_name.length_,type,field_name.ptr_,bVar5);
  Status::Status(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectSource::RenderBool(const ProtoStreamObjectSource* os,
                                           const google::protobuf::Type& type,
                                           StringPiece field_name,
                                           ObjectWriter* ow) {
  uint32 tag = os->stream_->ReadTag();
  uint64 buffer64 = 0;  // results in 'false' value as default, which is the
                        // default value of Bool wrapper
  if (tag != 0) {
    os->stream_->ReadVarint64(&buffer64);
    os->stream_->ReadTag();
  }
  ow->RenderBool(field_name, buffer64 != 0);
  return util::Status();
}